

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbor_reader_tests.cpp
# Opt level: O3

void check_parse_cbor(vector<unsigned_char,_std::allocator<unsigned_char>_> *v,json *expected)

{
  byte bVar1;
  char cVar2;
  char cVar3;
  byte *pbVar4;
  pointer phVar5;
  pointer puVar6;
  int iVar7;
  basic_ostream<char,_std::char_traits<char>_> *pbVar8;
  byte *pbVar9;
  pointer puVar10;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *__range1;
  anon_union_16_15_54cbd7ed_for_basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_5
  *this;
  json result;
  string s;
  AssertionHandler catchAssertionHandler_2;
  json j2;
  error_code ec;
  json_decoder<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>,_std::allocator<char>_>
  decoder;
  istringstream is;
  cbor_bytes_reader reader;
  anon_union_16_15_54cbd7ed_for_basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_5
  local_510;
  anon_union_16_15_54cbd7ed_for_basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_5
  local_500;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_4f0;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *local_4e0;
  undefined1 local_4d8 [8];
  undefined8 local_4d0;
  anon_union_16_15_54cbd7ed_for_basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_5
  *local_4c8;
  _func_int **local_4c0;
  char *pcStack_4b8;
  SourceLineInfo *local_4b0;
  bool local_49e;
  IResultCapture *local_498;
  basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_> local_490;
  error_code local_480;
  SourceLineInfo local_470;
  undefined1 local_460 [8];
  undefined8 uStack_458;
  cbor *local_450;
  char *local_448;
  size_t sStack_440;
  json *local_438;
  json_decoder<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>,_std::allocator<char>_>
  local_430;
  StringRef local_3b0;
  StringRef local_3a0;
  StringRef local_390;
  undefined1 local_380 [64];
  IResultCapture *local_340;
  ios_base local_308 [264];
  basic_cbor_parser<jsoncons::bytes_source,_std::allocator<char>_> local_200;
  undefined **local_108;
  long *local_f0;
  long local_e0 [2];
  long *local_d0;
  long local_c0 [2];
  void *local_b0;
  long local_a0;
  long *local_98;
  long local_88 [2];
  long *local_78;
  long local_68 [2];
  long *local_58;
  long local_48 [2];
  item_event_visitor *local_38;
  
  local_480._M_value = 0;
  local_480._M_cat = (error_category *)std::_V2::system_category();
  jsoncons::
  json_decoder<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>,_std::allocator<char>_>
  ::json_decoder(&local_430,(allocator_type *)&local_200,(temp_allocator_type *)local_380);
  local_380._16_4_ = 0x400;
  local_380._0_8_ = jsoncons::cbor::cbor_decode_options::vtable + 0x18;
  local_380._8_8_ = 0xb31fe8;
  jsoncons::cbor::basic_cbor_reader<jsoncons::bytes_source,std::allocator<char>>::
  basic_cbor_reader<std::vector<unsigned_char,std::allocator<unsigned_char>>const&>
            ((basic_cbor_reader<jsoncons::bytes_source,std::allocator<char>> *)&local_200,v,
             &local_430.super_basic_json_visitor<char>,(cbor_decode_options *)local_380,
             (allocator<char> *)local_4d8);
  jsoncons::cbor::basic_cbor_parser<jsoncons::bytes_source,_std::allocator<char>_>::reset
            (&local_200);
  jsoncons::cbor::basic_cbor_parser<jsoncons::bytes_source,_std::allocator<char>_>::parse
            (&local_200,local_38,&local_480);
  jsoncons::
  json_decoder<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>,_std::allocator<char>_>
  ::get_result((json_decoder<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>,_std::allocator<char>_>
                *)&local_510.common_);
  this = &local_510;
  iVar7 = jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>::compare
                    ((basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_> *)
                     &this->common_,expected);
  if (iVar7 != 0) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"v: ",3);
    pbVar4 = (v->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
             super__Vector_impl_data._M_finish;
    local_4e0 = v;
    for (pbVar9 = (v->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
                  super__Vector_impl_data._M_start; pbVar9 != pbVar4; pbVar9 = pbVar9 + 1) {
      bVar1 = *pbVar9;
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"0x",2);
      *(uint *)(remainder + *(long *)(std::cout + -0x18)) =
           *(uint *)(remainder + *(long *)(std::cout + -0x18)) & 0xffffffb5 | 8;
      std::ostream::operator<<(&std::cout,(uint)bVar1);
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\n",1);
    v = local_4e0;
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"result: ",8);
    pbVar8 = jsoncons::operator<<
                       ((basic_ostream<char,_std::char_traits<char>_> *)&std::cout,
                        (basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_> *)
                        &local_510.common_);
    std::__ostream_insert<char,std::char_traits<char>>(pbVar8,"\n",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"expected: ",10);
    pbVar8 = jsoncons::operator<<
                       ((basic_ostream<char,_std::char_traits<char>_> *)&std::cout,expected);
    std::__ostream_insert<char,std::char_traits<char>>(pbVar8,"\n",1);
  }
  local_4d8 = (undefined1  [8])0x7fc916;
  local_4d0 = 7;
  local_460 = (undefined1  [8])0x814b19;
  uStack_458 = (char *)0x2f;
  Catch::StringRef::StringRef(&local_390,"result == expected");
  Catch::AssertionHandler::AssertionHandler
            ((AssertionHandler *)local_380,(StringRef *)local_4d8,(SourceLineInfo *)local_460,
             local_390,Normal);
  iVar7 = jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>::compare
                    ((basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_> *)
                     &this->common_,expected);
  Catch::StringRef::StringRef((StringRef *)local_460,"==");
  local_4d0._0_2_ = CONCAT11(iVar7 == 0,true);
  local_4d8 = (undefined1  [8])&PTR_streamReconstructedExpression_00b30630;
  local_4c0 = (_func_int **)local_460;
  pcStack_4b8 = uStack_458;
  local_4c8 = this;
  local_4b0 = (SourceLineInfo *)expected;
  Catch::AssertionHandler::handleExpr
            ((AssertionHandler *)local_380,(ITransientExpression *)local_4d8);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_4d8);
  Catch::AssertionHandler::complete((AssertionHandler *)local_380);
  if ((bool)local_380[0x3a] == false) {
    (*local_340->_vptr_IResultCapture[0xe])();
  }
  local_4d8 = (undefined1  [8])0x7f42b5;
  local_4d0 = 5;
  local_460 = (undefined1  [8])0x814b19;
  uStack_458 = (char *)0x30;
  Catch::StringRef::StringRef(&local_3a0,"result.tag() == expected.tag()");
  Catch::AssertionHandler::AssertionHandler
            ((AssertionHandler *)local_380,(StringRef *)local_4d8,(SourceLineInfo *)local_460,
             local_3a0,ContinueOnFailure);
  if ((local_510._0_1_ & 0xe) == 8) {
    this = &local_510;
    do {
      this = *(anon_union_16_15_54cbd7ed_for_basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_5
               **)((long)this + 8);
    } while ((undefined1  [16])((undefined1  [16])*this & (undefined1  [16])0xe) ==
             (undefined1  [16])0x8);
  }
  cVar2 = *(undefined1 *)((long)this + 1);
  local_500._0_1_ = cVar2;
  bVar1 = *(byte *)&expected->field_0;
  phVar5 = (pointer)expected;
  while ((bVar1 & 0xe) == 8) {
    phVar5 = (((anon_union_16_15_54cbd7ed_for_basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_5
                *)&phVar5->super_heap_string_base<unsigned_long,_std::allocator<char>_>)->byte_str_)
             .ptr_;
    bVar1 = (byte)(phVar5->super_heap_string_base<unsigned_long,_std::allocator<char>_>).extra_;
  }
  cVar3 = *(undefined1 *)
           ((long)&(phVar5->super_heap_string_base<unsigned_long,_std::allocator<char>_>).extra_ + 1
           );
  local_470.file = (char *)CONCAT71(local_470.file._1_7_,cVar3);
  Catch::StringRef::StringRef((StringRef *)local_460,"==");
  local_4d0._0_2_ = CONCAT11(cVar2 == cVar3,true);
  local_4d8 = (undefined1  [8])&PTR_streamReconstructedExpression_00b30980;
  local_4c8 = &local_500;
  local_4c0 = (_func_int **)local_460;
  pcStack_4b8 = uStack_458;
  local_4b0 = &local_470;
  Catch::AssertionHandler::handleExpr
            ((AssertionHandler *)local_380,(ITransientExpression *)local_4d8);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_4d8);
  Catch::AssertionHandler::complete((AssertionHandler *)local_380);
  if ((bool)local_380[0x3a] == false) {
    (*local_340->_vptr_IResultCapture[0xe])();
  }
  local_500._0_8_ = &local_4f0;
  local_500.int64_.val_ = 0;
  local_4f0._M_local_buf[0] = '\0';
  puVar6 = (v->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
           super__Vector_impl_data._M_finish;
  for (puVar10 = (v->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
                 super__Vector_impl_data._M_start; puVar10 != puVar6; puVar10 = puVar10 + 1) {
    std::__cxx11::string::push_back('\0');
  }
  std::__cxx11::istringstream::istringstream
            ((istringstream *)local_380,(string *)&local_500.common_,_S_in);
  local_4c8 = (anon_union_16_15_54cbd7ed_for_basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_5
               *)CONCAT44(local_4c8._4_4_,0x400);
  local_4d8 = (undefined1  [8])0xb31fc0;
  local_4d0 = 0xb31fe8;
  jsoncons::cbor::
  decode_cbor<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>
            ((cbor *)&local_490,(istream *)local_380,(cbor_decode_options *)local_4d8);
  local_460 = (undefined1  [8])0x7fc916;
  uStack_458 = (char *)0x7;
  local_470.file =
       "/workspace/llm4binary/github/license_c_cmakelists/danielaparker[P]jsoncons/test/cbor/src/cbor_reader_tests.cpp"
  ;
  local_470.line = 0x39;
  Catch::StringRef::StringRef(&local_3b0,"j2 == expected");
  Catch::AssertionHandler::AssertionHandler
            ((AssertionHandler *)local_4d8,(StringRef *)local_460,&local_470,local_3b0,Normal);
  iVar7 = jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>::compare
                    (&local_490,expected);
  Catch::StringRef::StringRef((StringRef *)&local_470,"==");
  uStack_458._0_2_ = CONCAT11(iVar7 == 0,true);
  local_460 = (undefined1  [8])&PTR_streamReconstructedExpression_00b30630;
  local_448 = local_470.file;
  sStack_440 = local_470.line;
  local_450 = (cbor *)&local_490;
  local_438 = expected;
  Catch::AssertionHandler::handleExpr
            ((AssertionHandler *)local_4d8,(ITransientExpression *)local_460);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_460);
  Catch::AssertionHandler::complete((AssertionHandler *)local_4d8);
  if (local_49e == false) {
    (*local_498->_vptr_IResultCapture[0xe])();
  }
  jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>::destroy(&local_490);
  std::__cxx11::istringstream::~istringstream((istringstream *)local_380);
  std::ios_base::~ios_base(local_308);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_500._0_8_ != &local_4f0) {
    operator_delete((void *)local_500._0_8_,
                    CONCAT71(local_4f0._M_allocated_capacity._1_7_,local_4f0._M_local_buf[0]) + 1);
  }
  jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>::destroy
            ((basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_> *)&local_510.common_)
  ;
  local_108 = &PTR__basic_item_event_visitor_to_json_visitor_00b2f4a8;
  if (local_58 != local_48) {
    operator_delete(local_58,local_48[0] + 1);
  }
  if (local_78 != local_68) {
    operator_delete(local_78,local_68[0] + 1);
  }
  if (local_98 != local_88) {
    operator_delete(local_98,local_88[0] + 1);
  }
  if (local_b0 != (void *)0x0) {
    operator_delete(local_b0,local_a0 - (long)local_b0);
  }
  if (local_d0 != local_c0) {
    operator_delete(local_d0,local_c0[0] + 1);
  }
  if (local_f0 != local_e0) {
    operator_delete(local_f0,local_e0[0] + 1);
  }
  jsoncons::cbor::basic_cbor_parser<jsoncons::bytes_source,_std::allocator<char>_>::
  ~basic_cbor_parser(&local_200);
  if (local_430.structure_stack_.
      super__Vector_base<jsoncons::json_decoder<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>,_std::allocator<char>_>::structure_info,_std::allocator<jsoncons::json_decoder<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>,_std::allocator<char>_>::structure_info>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_430.structure_stack_.
                    super__Vector_base<jsoncons::json_decoder<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>,_std::allocator<char>_>::structure_info,_std::allocator<jsoncons::json_decoder<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>,_std::allocator<char>_>::structure_info>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_430.structure_stack_.
                          super__Vector_base<jsoncons::json_decoder<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>,_std::allocator<char>_>::structure_info,_std::allocator<jsoncons::json_decoder<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>,_std::allocator<char>_>::structure_info>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_430.structure_stack_.
                          super__Vector_base<jsoncons::json_decoder<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>,_std::allocator<char>_>::structure_info,_std::allocator<jsoncons::json_decoder<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>,_std::allocator<char>_>::structure_info>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  std::
  vector<jsoncons::index_key_value<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>,_std::allocator<jsoncons::index_key_value<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_>_>
  ::~vector(&local_430.item_stack_);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_430.name_._M_dataplus._M_p != &local_430.name_.field_2) {
    operator_delete(local_430.name_._M_dataplus._M_p,
                    local_430.name_.field_2._M_allocated_capacity + 1);
  }
  jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>::destroy
            (&local_430.result_);
  return;
}

Assistant:

void check_parse_cbor(const std::vector<uint8_t>& v, const json& expected)
{
    JSONCONS_TRY
    {
        std::error_code ec;

        jsoncons::json_decoder<json> decoder;
        cbor_bytes_reader reader(v, decoder);
        reader.read(ec);

        json result = decoder.get_result();

        if (!(result == expected))
        {
            std::cout << "v: ";
            for (auto b : v)
            {
                std::cout << "0x" << std::hex << (int)b;
            }
            std::cout << "\n";
            std::cout << "result: " << result << "\n";
            std::cout << "expected: " << expected << "\n";
        }

        REQUIRE(result == expected);
        CHECK(result.tag() == expected.tag());

        std::string s;
        for (auto c : v)
        {
            s.push_back(c);
        }
        std::istringstream is(s);
        json j2 = decode_cbor<json>(is);
        REQUIRE(j2 == expected);
    }